

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O2

xpath_ast_node * __thiscall
pugi::impl::anon_unknown_0::xpath_parser::parse_path_or_unary_expression(xpath_parser *this)

{
  byte bVar1;
  lexeme_t lVar2;
  xpath_variable_set *this_00;
  char_t *pcVar3;
  size_t sVar4;
  int iVar5;
  bool bVar6;
  nodetest_t nVar7;
  byte *pbVar8;
  xpath_ast_node *pxVar9;
  xpath_variable *pxVar10;
  char_t *pcVar11;
  xpath_ast_node *pxVar12;
  xpath_parse_result *pxVar13;
  ulong uVar14;
  char *pcVar15;
  xpath_value_type xVar16;
  anon_union_8_5_7bd254c6_for__data *paVar17;
  ast_type_t type;
  xpath_lexer_string *in_RSI;
  xpath_ast_node *in_R8;
  char_t *in_R9;
  ulong uVar18;
  xpath_lexer *this_01;
  anon_union_8_5_7bd254c6_for__data *paVar19;
  xpath_ast_node *args [2];
  xpath_lexer_string local_48;
  xpath_lexer *local_38;
  
  paVar17 = (anon_union_8_5_7bd254c6_for__data *)args;
  lVar2 = (this->_lexer)._cur_lexeme;
  if (0xc < lVar2 - lex_minus) {
switchD_00695d7a_caseD_9:
    pxVar9 = parse_location_path(this);
    return pxVar9;
  }
  this_01 = &this->_lexer;
  switch(lVar2) {
  case lex_minus:
    xpath_lexer::next(this_01);
    pxVar9 = parse_expression(this,7);
    if (pxVar9 == (xpath_ast_node *)0x0) {
      return (xpath_ast_node *)0x0;
    }
    pxVar9 = alloc_node(this,ast_op_negate,xpath_type_number,pxVar9,(xpath_ast_node *)0x0);
    return pxVar9;
  default:
    goto switchD_00695d7a_caseD_9;
  case lex_var_ref:
switchD_00695d7a_caseD_b:
    this_00 = this->_variables;
    if (this_00 == (xpath_variable_set *)0x0) {
      pxVar13 = this->_result;
      pcVar15 = "Unknown variable: variable set is not provided";
    }
    else {
      pcVar3 = (this->_lexer)._cur_lexeme_contents.begin;
      uVar18 = (long)(this->_lexer)._cur_lexeme_contents.end - (long)pcVar3;
      pcVar11 = this->_scratch;
      local_38 = this_01;
      if ((0x1f < uVar18) &&
         (pcVar11 = (char_t *)
                    (*(code *)(anonymous_namespace)::xml_memory_management_function_storage<int>::
                              allocate)(uVar18 + 1), pcVar11 == (char_t *)0x0)) {
LAB_00696092:
        *this->_alloc->_error = true;
        return (xpath_ast_node *)0x0;
      }
      memcpy(pcVar11,pcVar3,uVar18);
      pcVar11[uVar18] = '\0';
      pxVar10 = xpath_variable_set::_find(this_00,pcVar11);
      if (pcVar11 != this->_scratch) {
        (*(code *)(anonymous_namespace)::xml_memory_management_function_storage<int>::deallocate)
                  (pcVar11);
      }
      this_01 = local_38;
      if (pxVar10 != (xpath_variable *)0x0) {
        xpath_lexer::next(local_38);
        xVar16 = pxVar10->_type;
        pxVar9 = (xpath_ast_node *)alloc_node(this);
        if (pxVar9 == (xpath_ast_node *)0x0) {
          return (xpath_ast_node *)0x0;
        }
        pxVar9->_type = '\x14';
        pxVar9->_rettype = (char)xVar16;
        pxVar9->_axis = '\0';
        pxVar9->_test = '\0';
        goto LAB_00695f35;
      }
      pxVar13 = this->_result;
      pcVar15 = "Unknown variable: variable set does not contain the given name";
    }
    break;
  case lex_open_brace:
switchD_00695d7a_caseD_c:
    xpath_lexer::next(this_01);
    pxVar9 = parse_expression(this,0);
    if (pxVar9 == (xpath_ast_node *)0x0) {
      return (xpath_ast_node *)0x0;
    }
    if ((this->_lexer)._cur_lexeme == lex_close_brace) {
      xpath_lexer::next(this_01);
      goto LAB_00695fe2;
    }
    pxVar13 = this->_result;
    pcVar15 = "Expected \')\' to match an opening \'(\'";
    break;
  case lex_quoted_string:
switchD_00695d7a_caseD_e:
    pxVar10 = (xpath_variable *)alloc_string(this,&(this->_lexer)._cur_lexeme_contents);
    if (pxVar10 == (xpath_variable *)0x0) {
      return (xpath_ast_node *)0x0;
    }
    xpath_lexer::next(this_01);
    pxVar9 = (xpath_ast_node *)alloc_node(this);
    if (pxVar9 == (xpath_ast_node *)0x0) {
      return (xpath_ast_node *)0x0;
    }
    pxVar9->_type = '\x12';
    pxVar9->_rettype = '\x03';
    pxVar9->_axis = '\0';
    pxVar9->_test = '\0';
LAB_00695f35:
    pxVar9->_left = (xpath_ast_node *)0x0;
    pxVar9->_right = (xpath_ast_node *)0x0;
    pxVar9->_next = (xpath_ast_node *)0x0;
    (pxVar9->_data).string = (char_t *)pxVar10;
    goto LAB_00695fe2;
  case lex_number:
switchD_00695d7a_caseD_f:
    pcVar3 = (this->_lexer)._cur_lexeme_contents.begin;
    uVar18 = (long)(this->_lexer)._cur_lexeme_contents.end - (long)pcVar3;
    pcVar11 = this->_scratch;
    if ((0x1f < uVar18) &&
       (pcVar11 = (char_t *)
                  (*(code *)(anonymous_namespace)::xml_memory_management_function_storage<int>::
                            allocate)(uVar18 + 1), pcVar11 == (char_t *)0x0)) goto LAB_00696092;
    memcpy(pcVar11,pcVar3,uVar18);
    pcVar11[uVar18] = '\0';
    local_38 = (xpath_lexer *)convert_string_to_number(pcVar11);
    if (pcVar11 != this->_scratch) {
      (*(code *)(anonymous_namespace)::xml_memory_management_function_storage<int>::deallocate)
                (pcVar11);
    }
    xpath_lexer::next(this_01);
    pxVar9 = (xpath_ast_node *)alloc_node(this);
    if (pxVar9 == (xpath_ast_node *)0x0) {
      return (xpath_ast_node *)0x0;
    }
    pxVar9->_type = '\x13';
    pxVar9->_rettype = '\x02';
    pxVar9->_axis = '\0';
    pxVar9->_test = '\0';
    pxVar9->_left = (xpath_ast_node *)0x0;
    pxVar9->_right = (xpath_ast_node *)0x0;
    pxVar9->_next = (xpath_ast_node *)0x0;
    (pxVar9->_data).number = (double)local_38;
LAB_00695fe2:
    local_38 = (xpath_lexer *)this->_depth;
    while (lVar2 = (this->_lexer)._cur_lexeme, lVar2 == lex_open_square_brace) {
      xpath_lexer::next(this_01);
      uVar18 = this->_depth + 1;
      this->_depth = uVar18;
      if (0x400 < uVar18) {
        pxVar13 = this->_result;
        pcVar15 = "Exceeded maximum allowed query depth";
        goto LAB_0069613c;
      }
      if (pxVar9->_rettype != '\x01') {
        pxVar13 = this->_result;
        pcVar15 = "Predicate has to be applied to node set";
        goto LAB_0069613c;
      }
      pxVar12 = parse_expression(this,0);
      if (pxVar12 == (xpath_ast_node *)0x0) {
        return (xpath_ast_node *)0x0;
      }
      pxVar9 = alloc_node(this,ast_filter,pxVar9,pxVar12,(predicate_t)in_R8);
      if (pxVar9 == (xpath_ast_node *)0x0) {
        return (xpath_ast_node *)0x0;
      }
      if ((this->_lexer)._cur_lexeme != lex_close_square_brace) {
        pxVar13 = this->_result;
        pcVar15 = "Expected \']\' to match an opening \'[\'";
        goto LAB_0069613c;
      }
      xpath_lexer::next(this_01);
    }
    this->_depth = (size_t)local_38;
    if ((lVar2 & ~lex_equal) != lex_slash) {
      return pxVar9;
    }
    xpath_lexer::next(this_01);
    if (lVar2 != lex_double_slash) {
LAB_006960f1:
      pxVar9 = parse_relative_location_path(this,pxVar9);
      return pxVar9;
    }
    if (pxVar9->_rettype == '\x01') {
      pxVar9 = alloc_node(this,(ast_type_t)pxVar9,(xpath_ast_node *)0x5,axis_attribute,nodetest_none
                          ,in_R9);
      if (pxVar9 == (xpath_ast_node *)0x0) {
        return (xpath_ast_node *)0x0;
      }
      goto LAB_006960f1;
    }
    pxVar13 = this->_result;
    pcVar15 = "Step has to be applied to node set";
    break;
  case lex_string:
    pbVar8 = (byte *)this_01->_cur;
    do {
      bVar1 = *pbVar8;
      pbVar8 = pbVar8 + 1;
    } while (((anonymous_namespace)::chartype_table[bVar1] & 8) != 0);
    if ((bVar1 != 0x28) ||
       (nVar7 = parse_node_test_type((xpath_parser *)&(this->_lexer)._cur_lexeme_contents,in_RSI),
       nVar7 != nodetest_none)) goto switchD_00695d7a_caseD_9;
    switch(lVar2) {
    case lex_var_ref:
      goto switchD_00695d7a_caseD_b;
    case lex_open_brace:
      goto switchD_00695d7a_caseD_c;
    default:
      pxVar13 = this->_result;
      pcVar15 = "Unrecognizable primary expression";
      break;
    case lex_quoted_string:
      goto switchD_00695d7a_caseD_e;
    case lex_number:
      goto switchD_00695d7a_caseD_f;
    case lex_string:
      goto switchD_00695e14_caseD_14;
    }
  }
LAB_0069613c:
  pxVar13->error = pcVar15;
LAB_0069613f:
  pxVar13->offset = (long)(this->_lexer)._cur_lexeme_pos - (long)this->_query;
  return (xpath_ast_node *)0x0;
switchD_00695e14_caseD_14:
  args[0] = (xpath_ast_node *)0x0;
  args[1] = (xpath_ast_node *)0x0;
  local_48.begin = (this->_lexer)._cur_lexeme_contents.begin;
  local_48.end = (this->_lexer)._cur_lexeme_contents.end;
  xpath_lexer::next(this_01);
  if ((this->_lexer)._cur_lexeme == lex_open_brace) {
    xpath_lexer::next(this_01);
    sVar4 = this->_depth;
    uVar18 = 0;
    pxVar9 = (xpath_ast_node *)0x0;
    while (lVar2 = (this->_lexer)._cur_lexeme, lVar2 != lex_close_brace) {
      if (uVar18 != 0) {
        if (lVar2 != lex_comma) {
          pcVar15 = "No comma between function arguments";
          goto switchD_0069624f_caseD_64;
        }
        xpath_lexer::next(this_01);
      }
      uVar14 = this->_depth + 1;
      this->_depth = uVar14;
      if (0x400 < uVar14) {
        pcVar15 = "Exceeded maximum allowed query depth";
        goto switchD_0069624f_caseD_64;
      }
      pxVar12 = parse_expression(this,0);
      if (pxVar12 == (xpath_ast_node *)0x0) {
        return (xpath_ast_node *)0x0;
      }
      paVar19 = (anon_union_8_5_7bd254c6_for__data *)&pxVar9->_next;
      if (uVar18 < 2) {
        paVar19 = paVar17;
      }
      paVar19->variable = (xpath_variable *)pxVar12;
      uVar18 = uVar18 + 1;
      paVar17 = paVar17 + 1;
      pxVar9 = pxVar12;
    }
    xpath_lexer::next(this_01);
    this->_depth = sVar4;
    pcVar15 = "Unrecognized function or wrong parameter count";
    switch(*local_48.begin) {
    case 'b':
      bVar6 = xpath_lexer_string::operator==(&local_48,"boolean");
      if ((uVar18 == 1) && (bVar6)) {
        type = ast_func_boolean;
LAB_0069669d:
        xVar16 = xpath_type_boolean;
        pxVar9 = args[0];
        goto LAB_006966a4;
      }
      break;
    case 'c':
      bVar6 = xpath_lexer_string::operator==(&local_48,"count");
      if ((uVar18 == 1) && (bVar6)) {
        if (args[0]->_rettype != '\x01') goto LAB_006967db;
        type = ast_func_count;
LAB_00696588:
        xVar16 = xpath_type_number;
        pxVar9 = args[0];
        goto LAB_006966a4;
      }
      bVar6 = xpath_lexer_string::operator==(&local_48,"contains");
      if ((uVar18 == 2) && (bVar6)) {
        type = ast_func_contains;
LAB_00696670:
        xVar16 = xpath_type_boolean;
        pxVar9 = args[0];
        in_R8 = args[1];
        goto LAB_006966a7;
      }
      bVar6 = xpath_lexer_string::operator==(&local_48,"concat");
      if ((1 < uVar18) && (bVar6)) {
        type = ast_func_concat;
        goto LAB_00696768;
      }
      bVar6 = xpath_lexer_string::operator==(&local_48,"ceiling");
      if ((uVar18 == 1) && (bVar6)) {
        type = ast_func_ceiling;
        goto LAB_00696588;
      }
      break;
    case 'f':
      bVar6 = xpath_lexer_string::operator==(&local_48,"false");
      if ((uVar18 == 0) && (bVar6)) {
        type = ast_func_false;
LAB_00696549:
        xVar16 = xpath_type_boolean;
LAB_0069654c:
        pxVar9 = (xpath_ast_node *)0x0;
        goto LAB_006966a4;
      }
      bVar6 = xpath_lexer_string::operator==(&local_48,"floor");
      if ((uVar18 == 1) && (bVar6)) {
        type = ast_func_floor;
        goto LAB_00696588;
      }
      break;
    case 'i':
      bVar6 = xpath_lexer_string::operator==(&local_48,"id");
      if ((uVar18 == 1) && (bVar6)) {
        type = ast_func_id;
        xVar16 = xpath_type_node_set;
        pxVar9 = args[0];
        goto LAB_006966a4;
      }
      break;
    case 'l':
      bVar6 = xpath_lexer_string::operator==(&local_48,"last");
      if ((uVar18 == 0) && (bVar6)) {
        type = ast_func_last;
LAB_006963e2:
        xVar16 = xpath_type_number;
        goto LAB_0069654c;
      }
      bVar6 = xpath_lexer_string::operator==(&local_48,"lang");
      if ((uVar18 == 1) && (bVar6)) {
        type = ast_func_lang;
        goto LAB_0069669d;
      }
      bVar6 = xpath_lexer_string::operator==(&local_48,"local-name");
      if ((uVar18 < 2) && (bVar6)) {
        if ((uVar18 != 1) || (args[0]->_rettype == '\x01')) {
          iVar5 = 0x1a;
          goto LAB_0069663a;
        }
        goto LAB_006967db;
      }
      break;
    case 'n':
      bVar6 = xpath_lexer_string::operator==(&local_48,"name");
      if ((uVar18 < 2) && (bVar6)) {
        if ((uVar18 != 1) || (args[0]->_rettype == '\x01')) {
          iVar5 = 0x1e;
LAB_0069663a:
          type = iVar5 - (uint)(uVar18 == 0);
          goto LAB_0069663e;
        }
      }
      else {
        bVar6 = xpath_lexer_string::operator==(&local_48,"namespace-uri");
        if ((1 < uVar18) || (!bVar6)) {
          bVar6 = xpath_lexer_string::operator==(&local_48,"normalize-space");
          if ((uVar18 < 2) && (bVar6)) {
            type = ast_func_normalize_space_1 - (uVar18 == 0);
            goto LAB_00696768;
          }
          bVar6 = xpath_lexer_string::operator==(&local_48,"not");
          if ((uVar18 == 1) && (bVar6)) {
            type = ast_func_not;
            goto LAB_0069669d;
          }
          bVar6 = xpath_lexer_string::operator==(&local_48,"number");
          if ((uVar18 < 2) && (bVar6)) {
            iVar5 = 0x33;
            goto LAB_00696580;
          }
          break;
        }
        if ((uVar18 != 1) || (args[0]->_rettype == '\x01')) {
          iVar5 = 0x1c;
          goto LAB_0069663a;
        }
      }
LAB_006967db:
      pcVar15 = "Function has to be applied to node set";
      break;
    case 'p':
      bVar6 = xpath_lexer_string::operator==(&local_48,"position");
      if ((uVar18 == 0) && (bVar6)) {
        type = ast_func_position;
        goto LAB_006963e2;
      }
      break;
    case 'r':
      bVar6 = xpath_lexer_string::operator==(&local_48,"round");
      if ((uVar18 == 1) && (bVar6)) {
        type = ast_func_round;
        goto LAB_00696588;
      }
      break;
    case 's':
      bVar6 = xpath_lexer_string::operator==(&local_48,"string");
      if ((1 < uVar18) || (!bVar6)) {
        bVar6 = xpath_lexer_string::operator==(&local_48,"string-length");
        if ((1 < uVar18) || (!bVar6)) {
          bVar6 = xpath_lexer_string::operator==(&local_48,"starts-with");
          if ((uVar18 == 2) && (bVar6)) {
            type = ast_func_starts_with;
            goto LAB_00696670;
          }
          bVar6 = xpath_lexer_string::operator==(&local_48,"substring-before");
          if ((uVar18 == 2) && (bVar6)) {
            type = ast_func_substring_before;
          }
          else {
            bVar6 = xpath_lexer_string::operator==(&local_48,"substring-after");
            if ((uVar18 == 2) && (bVar6)) {
              type = ast_func_substring_after;
            }
            else {
              bVar6 = xpath_lexer_string::operator==(&local_48,"substring");
              if (((uVar18 & 0xfffffffffffffffe) != 2) || (!bVar6)) {
                bVar6 = xpath_lexer_string::operator==(&local_48,"sum");
                if ((uVar18 == 1) && (bVar6)) {
                  if (args[0]->_rettype != '\x01') goto LAB_006967db;
                  type = ast_func_sum;
                  goto LAB_00696588;
                }
                break;
              }
              type = uVar18 == 2 ^ ast_func_substring_3;
            }
          }
          goto LAB_00696768;
        }
        iVar5 = 0x29;
LAB_00696580:
        type = iVar5 - (uint)(uVar18 == 0);
        goto LAB_00696588;
      }
      type = ast_func_string_1 - (uVar18 == 0);
LAB_0069663e:
      xVar16 = xpath_type_string;
      pxVar9 = args[0];
LAB_006966a4:
      in_R8 = (xpath_ast_node *)0x0;
LAB_006966a7:
      pxVar9 = alloc_node(this,type,xVar16,pxVar9,in_R8);
      if (pxVar9 == (xpath_ast_node *)0x0) {
        return (xpath_ast_node *)0x0;
      }
      goto LAB_00695fe2;
    case 't':
      bVar6 = xpath_lexer_string::operator==(&local_48,"translate");
      if ((uVar18 == 3) && (bVar6)) {
        type = ast_func_translate;
LAB_00696768:
        xVar16 = xpath_type_string;
        pxVar9 = args[0];
        in_R8 = args[1];
        goto LAB_006966a7;
      }
      bVar6 = xpath_lexer_string::operator==(&local_48,"true");
      if ((uVar18 == 0) && (bVar6)) {
        type = ast_func_true;
        goto LAB_00696549;
      }
    }
  }
  else {
    pcVar15 = "Unrecognized function call";
  }
switchD_0069624f_caseD_64:
  pxVar13 = this->_result;
  pxVar13->error = pcVar15;
  goto LAB_0069613f;
}

Assistant:

xpath_ast_node* parse_path_or_unary_expression()
		{
			// Clarification.
			// PathExpr begins with either LocationPath or FilterExpr.
			// FilterExpr begins with PrimaryExpr
			// PrimaryExpr begins with '$' in case of it being a variable reference,
			// '(' in case of it being an expression, string literal, number constant or
			// function call.
			if (_lexer.current() == lex_var_ref || _lexer.current() == lex_open_brace ||
				_lexer.current() == lex_quoted_string || _lexer.current() == lex_number ||
				_lexer.current() == lex_string)
			{
				if (_lexer.current() == lex_string)
				{
					// This is either a function call, or not - if not, we shall proceed with location path
					const char_t* state = _lexer.state();

					while (PUGI_IMPL_IS_CHARTYPE(*state, ct_space)) ++state;

					if (*state != '(')
						return parse_location_path();

					// This looks like a function call; however this still can be a node-test. Check it.
					if (parse_node_test_type(_lexer.contents()) != nodetest_none)
						return parse_location_path();
				}

				xpath_ast_node* n = parse_filter_expression();
				if (!n) return NULL;

				if (_lexer.current() == lex_slash || _lexer.current() == lex_double_slash)
				{
					lexeme_t l = _lexer.current();
					_lexer.next();

					if (l == lex_double_slash)
					{
						if (n->rettype() != xpath_type_node_set)
							return error("Step has to be applied to node set");

						n = alloc_node(ast_step, n, axis_descendant_or_self, nodetest_type_node, NULL);
						if (!n) return NULL;
					}

					// select from location path
					return parse_relative_location_path(n);
				}

				return n;
			}
			else if (_lexer.current() == lex_minus)
			{
				_lexer.next();

				// precedence 7+ - only parses union expressions
				xpath_ast_node* n = parse_expression(7);
				if (!n) return NULL;

				return alloc_node(ast_op_negate, xpath_type_number, n);
			}
			else
			{
				return parse_location_path();
			}
		}